

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * __thiscall
duckdb::WriteJsonToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,yyjson_mut_doc *doc)

{
  char *__ptr;
  SerializationException *this_00;
  allocator local_59;
  size_t len;
  yyjson_write_err err;
  string local_40;
  
  __ptr = duckdb_yyjson::yyjson_mut_write_opts
                    ((yyjson_mut_doc *)this,0x20,(yyjson_alc *)0x0,&len,&err);
  if (__ptr != (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__ptr,__ptr + len);
    free(__ptr);
    duckdb_yyjson::yyjson_mut_doc_free((yyjson_mut_doc *)this);
    return __return_storage_ptr__;
  }
  duckdb_yyjson::yyjson_mut_doc_free((yyjson_mut_doc *)this);
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_40,"Failed to write JSON string: %s",&local_59);
  SerializationException::SerializationException<char_const*>(this_00,&local_40,err.msg);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string WriteJsonToString(yyjson_mut_doc *doc) {
	yyjson_write_err err;
	size_t len;
	constexpr yyjson_write_flag flags = YYJSON_WRITE_ALLOW_INVALID_UNICODE;
	char *json = yyjson_mut_write_opts(doc, flags, nullptr, &len, &err);
	if (!json) {
		yyjson_mut_doc_free(doc);
		throw SerializationException("Failed to write JSON string: %s", err.msg);
	}
	// Create a string from the JSON
	string result(json, len);

	// Free the JSON and the document
	free(json);
	yyjson_mut_doc_free(doc);

	// Return the result
	return result;
}